

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86_avx::forward
          (Gemm_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  _func_int **pp_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  _func_int *p_Var14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int j;
  uint uVar23;
  undefined4 uVar24;
  size_t sVar25;
  int iVar26;
  Mat *pMVar27;
  Mat *pMVar28;
  int iVar29;
  int *piVar30;
  ulong uVar31;
  int iVar32;
  bool bVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  Mat *local_308;
  Mat *local_2f0;
  Mat *local_2e8;
  int TILE_K;
  ulong local_2c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2b8;
  Gemm_x86_avx *local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  Mat *local_288;
  int TILE_K_1;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  ulong local_1d0;
  Mat local_1c8;
  Mat local_178;
  Mat *local_128;
  ulong local_120;
  Mat local_118;
  ulong local_d0;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  uint local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int TILE_K_2;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  p_Var14 = this->_vptr_Gemm_x86_avx[-3];
  iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var14 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var14) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = *(int *)((long)&(this->CT_data).c + (long)p_Var14);
    if (iVar12 != 0) {
      if (iVar16 == 0) {
        uVar19 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar19 = pMVar1->w;
      }
      goto LAB_0047457a;
    }
    if (iVar16 == 0) {
      uVar19 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
    else {
      uVar19 = pMVar1->w;
    }
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var14) == 0) {
      uVar23 = pMVar1[1].w;
    }
    else {
      uVar23 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
    }
  }
  else if (iVar12 == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = *(uint *)(&this->field_0xec + (long)p_Var14);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var14) == 0) {
      uVar23 = pMVar1->w;
    }
    else {
      uVar23 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
  }
  else {
    uVar19 = *(uint *)(&this->field_0xec + (long)p_Var14);
LAB_0047457a:
    uVar23 = *(uint *)(&this->field_0xf0 + (long)p_Var14);
  }
  local_278.cstep = 0;
  uVar34 = 0;
  uVar35 = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  p_Var14 = this->_vptr_Gemm_x86_avx[-3];
  local_2a8 = this;
  if (*(int *)(&this->field_0xe8 + (long)p_Var14) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var14 + 4));
    if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var14) == 0) {
      if (iVar12 == 0) {
        bVar33 = true;
        if (lVar21 == 0xd8) {
          local_278.data = pMVar1[2].data;
          piVar30 = pMVar1[2].refcount;
          sVar25 = pMVar1[2].elemsize;
          local_278.elempack = pMVar1[2].elempack;
          local_278.allocator = pMVar1[2].allocator;
          uVar34._0_4_ = pMVar1[2].dims;
          uVar34._4_4_ = pMVar1[2].w;
          uVar35._0_4_ = pMVar1[2].h;
          uVar35._4_4_ = pMVar1[2].d;
          local_278.c = pMVar1[2].c;
          local_278.cstep = pMVar1[2].cstep;
          if (piVar30 == (int *)0x0) {
            piVar30 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar25 = 0;
          piVar30 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar30,0);
        local_278.refcount._4_4_ = (uint)((ulong)piVar30 >> 0x20);
        local_278.elemsize._0_4_ = (int)sVar25;
        local_278.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
        local_278.dims = (int)uVar34;
        local_278.w = (int)((ulong)uVar34 >> 0x20);
        local_278.h = (int)uVar35;
        local_278.d = (int)((ulong)uVar35 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_00476a8e;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
      else {
        bVar33 = true;
        if (lVar21 == 0x90) {
          local_278.data = pMVar1[1].data;
          piVar30 = pMVar1[1].refcount;
          sVar25 = pMVar1[1].elemsize;
          local_278.elempack = pMVar1[1].elempack;
          local_278.allocator = pMVar1[1].allocator;
          uVar34._0_4_ = pMVar1[1].dims;
          uVar34._4_4_ = pMVar1[1].w;
          uVar35._0_4_ = pMVar1[1].h;
          uVar35._4_4_ = pMVar1[1].d;
          local_278.c = pMVar1[1].c;
          local_278.cstep = pMVar1[1].cstep;
          if (piVar30 == (int *)0x0) {
            piVar30 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            LOCK();
            *piVar30 = *piVar30 + 1;
            UNLOCK();
            bVar33 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar25 = 0;
          piVar30 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar30,0);
        local_278.refcount._4_4_ = (uint)((ulong)piVar30 >> 0x20);
        local_278.elemsize._0_4_ = (int)sVar25;
        local_278.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
        local_278.dims = (int)uVar34;
        local_278.w = (int)((ulong)uVar34 >> 0x20);
        local_278.h = (int)uVar35;
        local_278.d = (int)((ulong)uVar35 >> 0x20);
        if (!bVar33) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_00476a8e;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    else if (iVar12 == 0) {
      bVar33 = true;
      if (lVar21 == 0x90) {
        local_278.data = pMVar1[1].data;
        piVar30 = pMVar1[1].refcount;
        sVar25 = pMVar1[1].elemsize;
        local_278.elempack = pMVar1[1].elempack;
        local_278.allocator = pMVar1[1].allocator;
        uVar34._0_4_ = pMVar1[1].dims;
        uVar34._4_4_ = pMVar1[1].w;
        uVar35._0_4_ = pMVar1[1].h;
        uVar35._4_4_ = pMVar1[1].d;
        local_278.c = pMVar1[1].c;
        local_278.cstep = pMVar1[1].cstep;
        if (piVar30 == (int *)0x0) {
          piVar30 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_278.cstep = 0;
        local_278.c = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar25 = 0;
        piVar30 = (int *)0x0;
        local_278.data = (void *)0x0;
      }
      local_278.refcount._0_4_ = SUB84(piVar30,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar30 >> 0x20);
      local_278.elemsize._0_4_ = (int)sVar25;
      local_278.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_278.dims = (int)uVar34;
      local_278.w = (int)((ulong)uVar34 >> 0x20);
      local_278.h = (int)uVar35;
      local_278.d = (int)((ulong)uVar35 >> 0x20);
      if (!bVar33) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_278.allocator == (Allocator *)0x0) goto LAB_00476a8e;
          (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
        }
      }
    }
    else {
      bVar33 = true;
      if (lVar21 == 0x48) {
        local_278.data = pMVar1->data;
        piVar30 = pMVar1->refcount;
        sVar25 = pMVar1->elemsize;
        local_278.elempack = pMVar1->elempack;
        local_278.allocator = pMVar1->allocator;
        uVar34._0_4_ = pMVar1->dims;
        uVar34._4_4_ = pMVar1->w;
        uVar35._0_4_ = pMVar1->h;
        uVar35._4_4_ = pMVar1->d;
        local_278.c = pMVar1->c;
        local_278.cstep = pMVar1->cstep;
        if (piVar30 == (int *)0x0) {
          piVar30 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
          bVar33 = false;
        }
      }
      else {
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar25 = 0;
        piVar30 = (int *)0x0;
        local_278.data = (void *)0x0;
        local_278.c = 0;
        local_278.cstep = 0;
      }
      local_278.refcount._0_4_ = SUB84(piVar30,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar30 >> 0x20);
      local_278.elemsize._0_4_ = (int)sVar25;
      local_278.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_278.dims = (int)uVar34;
      local_278.w = (int)((ulong)uVar34 >> 0x20);
      local_278.h = (int)uVar35;
      local_278.d = (int)((ulong)uVar35 >> 0x20);
      local_2b8 = top_blobs;
      if (!bVar33) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
LAB_00476a8e:
            free(local_278.data);
          }
          else {
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    pvVar8 = local_2b8;
    uVar15 = (ulong)local_2b8 >> 0x20;
    local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar15 << 0x20);
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      local_2b8._4_4_ = SUB84(pvVar8,4);
      uVar24 = local_2b8._4_4_;
      if (local_278.dims == 1) {
        uVar13 = (uint)(local_278.w * local_278.elempack == uVar19);
        if (local_278.w * local_278.elempack == uVar23) {
          uVar13 = 4;
        }
        local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                    CONCAT44(local_2b8._4_4_,uVar13);
      }
      else {
        bVar33 = local_278.dims == 2;
        local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar15 << 0x20);
        if (local_278.w == 1U && bVar33) {
          local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(uVar24,(uint)(local_278.elempack * local_278.h == uVar19) * 2);
        }
        if ((local_278.w == 1U && bVar33 || bVar33) && (local_278.w == uVar23)) {
          uVar24 = (int)local_2b8;
          if (local_278.elempack * local_278.h == uVar19) {
            uVar24 = 3;
          }
          if (local_278.elempack * local_278.h == 1) {
            uVar24 = 4;
          }
          local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(local_2b8._4_4_,uVar24);
        }
      }
      if (*(float *)((long)&(this->CT_data).d + (long)this->_vptr_Gemm_x86_avx[-3]) != 1.0) {
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        local_1c8.w = local_1c8.refcount._4_4_;
        local_1c8.h = (int)local_1c8.elemsize;
        Mat::create_like(&local_1c8,&local_278,opt->workspace_allocator);
        uVar13 = local_278.c * (int)local_278.cstep * local_278.elempack;
        pp_Var2 = this->_vptr_Gemm_x86_avx;
        uVar18 = 0;
        uVar15 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar15 = uVar18;
        }
        for (; uVar15 != uVar18; uVar18 = uVar18 + 1) {
          *(float *)((long)local_1c8.data + uVar18 * 4) =
               *(float *)((long)&(this->CT_data).d + (long)pp_Var2[-3]) *
               *(float *)((long)local_278.data + uVar18 * 4);
        }
        piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar30 != (int *)0x0) {
          LOCK();
          *piVar30 = *piVar30 + 1;
          UNLOCK();
        }
        piVar30 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        if (piVar30 != (int *)0x0) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_278.allocator == (Allocator *)0x0) {
              free(local_278.data);
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        local_278.data = local_1c8.data;
        local_278.refcount._0_4_ = local_1c8.refcount._0_4_;
        local_278.refcount._4_4_ = local_1c8.refcount._4_4_;
        local_278.elemsize._0_4_ = (int)local_1c8.elemsize;
        local_278.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_278.elempack = local_1c8.elempack;
        local_278.allocator = local_1c8.allocator;
        local_278.dims = local_1c8.dims;
        local_278.w = local_1c8.w;
        local_278.h = local_1c8.h;
        local_278.d = local_1c8.d;
        local_278.c = local_1c8.c;
        local_278.cstep = local_1c8.cstep;
        if (piVar30 != (int *)0x0) {
          LOCK();
          *piVar30 = *piVar30 + -1;
          UNLOCK();
          if (*piVar30 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              free(local_1c8.data);
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_278 != &this->CT_data) {
      piVar30 = (this->CT_data).refcount;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + 1;
        UNLOCK();
      }
      local_278.data = (this->CT_data).data;
      piVar30 = (this->CT_data).refcount;
      local_278.refcount._0_4_ = SUB84(piVar30,0);
      local_278.refcount._4_4_ = (uint)((ulong)piVar30 >> 0x20);
      sVar25 = (this->CT_data).elemsize;
      local_278.elemsize._0_4_ = (int)sVar25;
      local_278.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
      local_278.elempack = (this->CT_data).elempack;
      local_278.allocator = (this->CT_data).allocator;
      uVar3 = (this->CT_data).dims;
      uVar4 = (this->CT_data).w;
      uVar5 = (this->CT_data).h;
      uVar6 = (this->CT_data).d;
      local_278.c = (this->CT_data).c;
      local_278.cstep = (this->CT_data).cstep;
      p_Var14 = this->_vptr_Gemm_x86_avx[-3];
      local_278.dims = uVar3;
      local_278.w = uVar4;
      local_278.h = uVar5;
      local_278.d = uVar6;
    }
    local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                CONCAT44(local_2b8._4_4_,*(undefined4 *)(&this->field_0xf8 + (long)p_Var14));
  }
  p_Var14 = this->_vptr_Gemm_x86_avx[-3];
  if (opt->use_packing_layout == true) {
    uVar13 = uVar23;
    if (*(int *)(&this->field_0x108 + (long)p_Var14) == 0) {
      uVar13 = uVar19;
    }
    local_120 = 8;
    if ((uVar13 & 7) != 0) {
      local_120 = (ulong)((uVar13 & 3) == 0) * 3 + 1;
    }
  }
  else {
    local_120 = 1;
  }
  if (*(uint *)(&this->field_0x100 + (long)p_Var14) != 0) {
    local_120 = (ulong)*(uint *)(&this->field_0x100 + (long)p_Var14);
  }
  iVar12 = (int)local_120;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = uVar23;
  if (*(int *)(&this->field_0x108 + (long)p_Var14) != 0) {
    uVar13 = uVar19;
    uVar19 = uVar23;
  }
  if (*(int *)(&this->field_0xfc + (long)p_Var14) == 0) {
    Mat::create(this_00,uVar13,(int)uVar19 / iVar12,(ulong)(uint)(iVar12 * 4),iVar12,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar13,1,(int)uVar19 / iVar12,(ulong)(uint)(iVar12 * 4),iVar12,
                opt->blob_allocator);
  }
  iVar12 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_00476813;
  iVar12 = this->nT;
  iVar16 = iVar12;
  if (iVar12 == 0) {
    iVar16 = opt->num_threads;
  }
  if (opt->num_threads != iVar12 && iVar12 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  p_Var14 = this->_vptr_Gemm_x86_avx[-3];
  iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var14 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var14) == 0) {
    pMVar28 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar12 == 0) {
      iVar12 = *(int *)((long)&(this->CT_data).c + (long)p_Var14);
      iVar20 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var14);
      if (iVar12 == 0) {
        iVar29 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
        iVar9 = pMVar28->w;
      }
      else {
        iVar29 = pMVar28->w;
        iVar9 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
      }
      if (iVar20 == 0) {
        uVar19 = pMVar28[1].w;
      }
      else {
        uVar19 = pMVar28[1].elempack * (&pMVar28[1].h)[(ulong)(pMVar28[1].dims == 3) * 2];
      }
      local_298 = (ulong)uVar19;
      local_230 = CONCAT44(local_230._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var14));
      get_optimal_tile_mnk
                (iVar29,uVar19,iVar9,*(int *)(&this->field_0x10c + (long)p_Var14),
                 *(int *)(&this->field_0x110 + (long)p_Var14),
                 *(int *)(&this->field_0x114 + (long)p_Var14),&TILE_K,&TILE_K_1,&TILE_K_2,iVar16);
      local_d0 = (ulong)(uint)TILE_K;
      local_1d8 = CONCAT44(local_1d8._4_4_,(iVar29 + TILE_K + -1) / TILE_K);
      uVar15 = (ulong)(uint)TILE_K_2;
      iVar22 = (iVar9 + TILE_K_2 + -1) / TILE_K_2;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_2 * TILE_K,iVar22,iVar16,4,opt->workspace_allocator);
      iVar32 = ((int)local_298 + TILE_K_1 + -1) / TILE_K_1;
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      local_288 = (Mat *)(ulong)(uint)TILE_K_1;
      Mat::create(&local_228,TILE_K_2 * TILE_K_1,iVar22,iVar32,4,opt->workspace_allocator);
      iVar32 = iVar32 * iVar22;
      iVar29 = 0;
      if (iVar32 < 1) {
        iVar32 = 0;
        iVar29 = 0;
      }
      for (; pMVar27 = local_288, iVar10 = (int)local_288, iVar32 != iVar29; iVar29 = iVar29 + 1) {
        iVar11 = (iVar29 / iVar22) * iVar10;
        iVar26 = (int)((long)iVar29 % (long)iVar22) * TILE_K_2;
        iVar17 = (int)local_298 - iVar11;
        if (iVar10 < iVar17) {
          iVar17 = iVar10;
        }
        iVar10 = iVar9 - iVar26;
        if (TILE_K_2 < iVar9 - iVar26) {
          iVar10 = TILE_K_2;
        }
        local_178.cstep = (size_t)local_228.w;
        local_178.data =
             (void *)((long)local_228.data +
                     ((long)iVar29 % (long)iVar22 & 0xffffffffU) * local_178.cstep *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize) +
                     (long)(iVar29 / iVar22) * local_228.cstep *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = (int)local_228.elemsize;
        local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
        local_178.elempack = local_228.elempack;
        local_178.allocator = local_228.allocator;
        local_178.dims = 2;
        local_178.w = local_228.w;
        local_178.h = 1;
        local_178.d = 1;
        local_178.c = 1;
        if (iVar20 == 0) {
          transpose_pack_B_tile(pMVar28 + 1,&local_178,iVar11,iVar17,iVar26,iVar10);
        }
        else {
          pack_B_tile(pMVar28 + 1,&local_178,iVar11,iVar17,iVar26,iVar10);
        }
      }
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.allocator = (Allocator *)0x0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      if ((((int)local_230 != 0) || ((int)local_2b8 == 3)) || (TILE_K_2 < iVar9)) {
        Mat::create(&local_178,iVar10 * (int)local_d0,1,iVar16,4,opt->workspace_allocator);
      }
      local_1d0 = CONCAT71(local_1d0._1_7_,(int)local_230 == 0);
      local_128 = (Mat *)0x0;
      iVar16 = (int)local_1d8;
      if ((int)local_1d8 < 1) {
        iVar16 = 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,iVar16);
      uVar18 = local_120;
      uVar31 = local_298;
      local_290 = uVar15;
      while( true ) {
        this = local_2a8;
        iVar16 = (int)uVar18;
        if ((int)local_128 == (int)local_1d8) break;
        if (iVar12 == 0) {
          iVar16 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
          iVar20 = pMVar28->w;
        }
        else {
          iVar16 = pMVar28->w;
          iVar20 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
        }
        local_2a0 = CONCAT44(local_2a0._4_4_,iVar20);
        iVar29 = (int)local_d0;
        uVar19 = (int)local_128 * iVar29;
        local_2c8 = (ulong)uVar19;
        iVar16 = iVar16 - uVar19;
        if (iVar29 < iVar16) {
          iVar16 = iVar29;
        }
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118.elemsize._4_4_ = 0;
        local_118.elempack = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        if ((((int)local_230 != 0) || ((int)local_2b8 == 3)) || ((int)uVar15 < iVar20)) {
          iVar20 = get_omp_thread_num();
          uVar7 = CONCAT44(local_178.elemsize._4_4_,(int)local_178.elemsize);
          local_118.cstep =
               ((long)local_178.w * (long)local_178.h * uVar7 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (local_178.dims == 4) {
            local_118.cstep = (long)local_178.w * (long)local_178.h;
          }
          local_118.dims = local_178.dims + -1;
          local_118.data = (void *)((long)iVar20 * uVar7 * local_178.cstep + (long)local_178.data);
          local_118.elemsize._0_4_ = (int)local_178.elemsize;
          local_118.elemsize._4_4_ = local_178.elemsize._4_4_;
          local_118.elempack = local_178.elempack;
          local_118.allocator = local_178.allocator;
          local_118.w = local_178.w;
          local_118.h = local_178.h;
          local_118.d = 1;
          local_118.c = local_178.d;
        }
        local_118.refcount._4_4_ = 0;
        local_118.refcount._0_4_ = 0;
        for (iVar20 = 0; iVar29 = (int)uVar31 - iVar20, iVar29 != 0 && iVar20 <= (int)uVar31;
            iVar20 = iVar20 + (int)local_288) {
          if ((int)pMVar27 < iVar29) {
            iVar29 = (int)pMVar27;
          }
          local_308 = &local_278;
          if ((int)local_2b8 == 3) {
            local_308 = &local_118;
            pack_A_tile(&local_278,local_308,(int)local_2c8,iVar16,iVar20,iVar29);
          }
          iVar9 = (int)local_2a0;
          iVar22 = (int)local_2a0;
          iVar32 = 0;
          while (uVar15 = local_290, iVar32 < iVar9) {
            iVar17 = (int)local_290;
            iVar10 = iVar22;
            if (iVar17 < iVar22) {
              iVar10 = iVar17;
            }
            iVar9 = get_omp_thread_num();
            local_b8 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
            local_88 = (size_t)local_1c8.w;
            _TILE_M = (void *)((long)local_1c8.data +
                              local_b8 * local_88 * (long)(iVar32 / iVar17) +
                              (long)iVar9 * local_1c8.cstep * local_b8);
            local_c0 = (int *)0x0;
            local_b0 = local_1c8.elempack;
            local_a8 = local_1c8.allocator;
            local_a0 = 2;
            local_9c = local_1c8.w;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_90 = 1;
            local_68 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
            local_38 = (size_t)local_228.w;
            _TILE_N = (void *)((long)local_228.data +
                              local_38 * local_68 * (long)(iVar32 / iVar17) +
                              (long)(iVar20 / (int)local_288) * local_228.cstep * local_68);
            local_70 = (int *)0x0;
            local_60 = local_228.elempack;
            local_58 = local_228.allocator;
            local_4c = local_228.w;
            local_48._0_4_ = 1;
            local_48._4_4_ = 1;
            local_50 = local_a0;
            local_40 = local_90;
            if (iVar20 == 0) {
              if (iVar12 == 0) {
                pack_A_tile(pMVar28,(Mat *)&TILE_M,(int)local_2c8,iVar16,iVar32,iVar10);
              }
              else {
                transpose_pack_A_tile(pMVar28,(Mat *)&TILE_M,(int)local_2c8,iVar16,iVar32,iVar10);
              }
            }
            iVar9 = (int)local_2a0;
            gemm_transB_packed_tile
                      ((Mat *)&TILE_M,(Mat *)&TILE_N,local_308,&local_118,this_00,(int)local_2b8,
                       (int)local_2c8,iVar16,iVar20,iVar29,iVar32,iVar10,
                       (bool)((int)local_2a0 <= iVar32 + iVar17 & (byte)local_1d0));
            iVar22 = iVar22 - iVar17;
            iVar32 = iVar32 + iVar17;
          }
          if ((int)local_230 != 0) {
            transpose_unpack_output_tile(&local_118,this_00,(int)local_2c8,iVar16,iVar20,iVar29);
          }
          uVar18 = local_120;
          pMVar27 = local_288;
          uVar31 = local_298;
        }
        local_128 = (Mat *)(ulong)((int)local_128 + 1);
      }
      piVar30 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar30 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004767a8;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar12 = *(int *)((long)&(this->CT_data).c + (long)p_Var14);
      local_298 = CONCAT44(local_298._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var14));
      iVar20 = *(int *)(&this->field_0xf4 + (long)p_Var14);
      local_1d0 = CONCAT44(local_1d0._4_4_,iVar12);
      if (iVar12 == 0) {
        iVar12 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
      }
      else {
        iVar12 = pMVar28->w;
      }
      iVar29 = *(int *)(&local_2a8->field_0x108 + (long)p_Var14);
      get_optimal_tile_mnk
                (iVar12,*(int *)(&this->field_0xf0 + (long)p_Var14),iVar20,
                 *(int *)(&this->field_0x10c + (long)p_Var14),
                 *(int *)(&this->field_0x110 + (long)p_Var14),
                 *(int *)(&this->field_0x114 + (long)p_Var14),&TILE_N,&TILE_K,&TILE_K_1,iVar16);
      local_1d8 = (ulong)_TILE_N & 0xffffffff;
      iVar12 = (iVar12 + TILE_N + -1) / TILE_N;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_N,(iVar20 + TILE_K_1 + -1) / TILE_K_1,iVar16,4,
                  opt->workspace_allocator);
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      if (((iVar29 != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < iVar20)) {
        Mat::create(&local_228,TILE_K * (int)local_1d8,1,iVar16,4,opt->workspace_allocator);
      }
      local_290 = CONCAT71(local_290._1_7_,iVar29 == 0);
      uVar15 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      local_128 = (Mat *)CONCAT44(local_128._4_4_,iVar12);
      uVar18 = local_120;
      while( true ) {
        this = local_2a8;
        iVar16 = (int)uVar18;
        if ((int)uVar15 == (int)local_128) break;
        if ((int)local_1d0 == 0) {
          iVar12 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
          iVar16 = pMVar28->w;
        }
        else {
          iVar12 = pMVar28->w;
          iVar16 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
        }
        iVar9 = (int)local_1d8;
        iVar22 = (int)uVar15 * iVar9;
        iVar20 = iVar12 - iVar22;
        if (iVar9 < iVar12 - iVar22) {
          iVar20 = iVar9;
        }
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        local_230 = uVar15;
        if (((iVar29 != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < iVar16)) {
          iVar12 = get_omp_thread_num();
          uVar15 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
          local_178.cstep =
               ((long)local_228.w * (long)local_228.h * uVar15 + 0xf & 0xfffffffffffffff0) / uVar15;
          if (local_228.dims == 4) {
            local_178.cstep = (long)local_228.w * (long)local_228.h;
          }
          local_178.dims = local_228.dims + -1;
          local_178.data = (void *)((long)iVar12 * uVar15 * local_228.cstep + (long)local_228.data);
          local_178.elemsize._0_4_ = (int)local_228.elemsize;
          local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
          local_178.elempack = local_228.elempack;
          local_178.allocator = local_228.allocator;
          local_178.w = local_228.w;
          local_178.h = local_228.h;
          local_178.d = 1;
          local_178.c = local_228.d;
        }
        iVar12 = TILE_K;
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        uVar15 = 0;
        while( true ) {
          iVar9 = (int)uVar15;
          uVar19 = (int)local_298 - iVar9;
          if (uVar19 == 0 || (int)local_298 < iVar9) break;
          if (iVar12 < (int)uVar19) {
            uVar19 = iVar12;
          }
          local_288 = &local_278;
          if ((int)local_2b8 == 3) {
            pack_A_tile(&local_278,&local_178,iVar22,iVar20,iVar9,uVar19);
            local_288 = &local_178;
          }
          iVar9 = iVar16;
          local_2c8 = uVar15;
          local_2a0 = (ulong)uVar19;
          iVar32 = 0;
          while (uVar18 = local_120, iVar32 < iVar16) {
            iVar10 = iVar9;
            if (TILE_K_1 < iVar9) {
              iVar10 = TILE_K_1;
            }
            iVar17 = get_omp_thread_num();
            local_118.cstep = (size_t)local_1c8.w;
            local_118.data =
                 (void *)((long)local_1c8.data +
                         CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) *
                         local_118.cstep * (long)(iVar32 / TILE_K_1) +
                         (long)iVar17 * local_1c8.cstep *
                         CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)local_1c8.elemsize;
            local_118.elemsize._4_4_ = local_1c8.elemsize._4_4_;
            local_118.elempack = local_1c8.elempack;
            local_118.allocator = local_1c8.allocator;
            local_118.dims = 2;
            local_118.w = local_1c8.w;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_b8 = (local_2a8->BT_data).elemsize;
            local_9c = (local_2a8->BT_data).w;
            local_88 = (size_t)(int)local_9c;
            local_b0 = (local_2a8->BT_data).elempack;
            local_a8 = (local_2a8->BT_data).allocator;
            local_c0 = (int *)0x0;
            _TILE_M = (void *)((long)(local_2a8->BT_data).data +
                              local_88 * local_b8 * (long)(iVar32 / TILE_K_1) +
                              (long)(int)((long)((ulong)(uint)((int)local_2c8 >> 0x1f) << 0x20 |
                                                local_2c8 & 0xffffffff) / (long)iVar12) *
                              (local_2a8->BT_data).cstep * local_b8);
            local_a0 = 2;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_90 = local_118.c;
            if ((int)local_2c8 == 0) {
              if ((int)local_1d0 == 0) {
                pack_A_tile(pMVar28,&local_118,iVar22,iVar20,iVar32,iVar10);
              }
              else {
                transpose_pack_A_tile(pMVar28,&local_118,iVar22,iVar20,iVar32,iVar10);
              }
            }
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_288,&local_178,this_00,(int)local_2b8,iVar22,
                       iVar20,(int)local_2c8,(int)local_2a0,iVar32,iVar10,
                       (bool)(iVar16 <= TILE_K_1 + iVar32 & (byte)local_290));
            iVar9 = iVar9 - TILE_K_1;
            iVar32 = TILE_K_1 + iVar32;
          }
          iVar9 = (int)local_2c8;
          if (iVar29 != 0) {
            transpose_unpack_output_tile(&local_178,this_00,iVar22,iVar20,iVar9,(int)local_2a0);
          }
          uVar15 = (ulong)(uint)(iVar9 + iVar12);
        }
        uVar15 = (ulong)((int)local_230 + 1);
      }
      piVar30 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004767a8;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar19 = *(uint *)(&this->field_0xec + (long)p_Var14);
    uVar15 = (ulong)uVar19;
    iVar20 = *(int *)(&this->field_0x108 + (long)p_Var14);
    local_230 = uVar15;
    if (iVar12 == 0) {
      pMVar28 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar12 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var14);
      iVar29 = *(int *)(&this->field_0xf4 + (long)p_Var14);
      if (iVar12 == 0) {
        uVar23 = pMVar28->w;
      }
      else {
        uVar23 = pMVar28->elempack * (&pMVar28->h)[(ulong)(pMVar28->dims == 3) * 2];
      }
      local_290 = (ulong)uVar23;
      get_optimal_tile_mnk
                (uVar19,uVar23,iVar29,*(int *)(&this->field_0x10c + (long)p_Var14),
                 *(int *)(&this->field_0x110 + (long)p_Var14),
                 *(int *)(&this->field_0x114 + (long)p_Var14),&TILE_N,&TILE_K,&TILE_K_1,iVar16);
      local_1d0 = (ulong)_TILE_N & 0xffffffff;
      uVar15 = (long)(int)(uVar19 + TILE_N + -1) / (long)TILE_N;
      local_2c8 = (ulong)(uint)TILE_K;
      iVar9 = ((int)local_290 + TILE_K + -1) / TILE_K;
      iVar32 = (iVar29 + TILE_K_1 + -1) / TILE_K_1;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_K,iVar32,iVar9,4,opt->workspace_allocator);
      iVar9 = iVar9 * iVar32;
      iVar22 = 0;
      if (iVar9 < 1) {
        iVar9 = iVar22;
      }
      for (; iVar10 = (int)local_2c8, iVar9 != iVar22; iVar22 = iVar22 + 1) {
        iVar11 = (iVar22 / iVar32) * iVar10;
        iVar26 = (int)((long)iVar22 % (long)iVar32) * TILE_K_1;
        iVar17 = (int)local_290 - iVar11;
        if (iVar10 < iVar17) {
          iVar17 = iVar10;
        }
        iVar10 = iVar29 - iVar26;
        if (TILE_K_1 < iVar29 - iVar26) {
          iVar10 = TILE_K_1;
        }
        local_228.cstep = (size_t)local_1c8.w;
        local_228.data =
             (void *)((long)local_1c8.data +
                     ((long)iVar22 % (long)iVar32 & 0xffffffffU) * local_228.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize) +
                     (long)(iVar22 / iVar32) * local_1c8.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize));
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = (int)local_1c8.elemsize;
        local_228.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_228.elempack = local_1c8.elempack;
        local_228.allocator = local_1c8.allocator;
        local_228.dims = 2;
        local_228.w = local_1c8.w;
        local_228.h = 1;
        local_228.d = 1;
        local_228.c = 1;
        if (iVar12 == 0) {
          transpose_pack_B_tile(pMVar28,&local_228,iVar11,iVar17,iVar26,iVar10);
        }
        else {
          pack_B_tile(pMVar28,&local_228,iVar11,iVar17,iVar26,iVar10);
        }
      }
      local_228.cstep = 0;
      local_298 = CONCAT71(local_298._1_7_,iVar20 != 0 || ((int)local_2b8 == 3 || TILE_K_1 < iVar29)
                          );
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      if (iVar20 != 0 || ((int)local_2b8 == 3 || TILE_K_1 < iVar29)) {
        Mat::create(&local_228,iVar10 * (int)local_1d0,1,iVar16,4,opt->workspace_allocator);
      }
      local_288 = (Mat *)CONCAT71(local_288._1_7_,iVar20 == 0);
      uVar31 = 0;
      this = local_2a8;
      uVar18 = uVar15 & 0xffffffff;
      if ((int)uVar15 < 1) {
        uVar18 = uVar31;
      }
      while (iVar16 = (int)local_120, uVar31 != uVar18) {
        iVar12 = (int)local_1d0;
        iVar9 = (int)uVar31 * iVar12;
        iVar16 = (int)local_230 - iVar9;
        if (iVar12 < iVar16) {
          iVar16 = iVar12;
        }
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        if ((char)local_298 != '\0') {
          iVar12 = get_omp_thread_num();
          uVar15 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
          local_178.cstep =
               ((long)local_228.w * (long)local_228.h * uVar15 + 0xf & 0xfffffffffffffff0) / uVar15;
          if (local_228.dims == 4) {
            local_178.cstep = (long)local_228.w * (long)local_228.h;
          }
          local_178.dims = local_228.dims + -1;
          local_178.data = (void *)((long)iVar12 * uVar15 * local_228.cstep + (long)local_228.data);
          local_178.elemsize._0_4_ = (int)local_228.elemsize;
          local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
          local_178.elempack = local_228.elempack;
          local_178.allocator = local_228.allocator;
          local_178.w = local_228.w;
          local_178.h = local_228.h;
          local_178.d = 1;
          local_178.c = local_228.d;
        }
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_2a0 = uVar31;
        for (iVar12 = 0; iVar22 = (int)local_290 - iVar12, iVar22 != 0 && iVar12 <= (int)local_290;
            iVar12 = iVar12 + (int)local_2c8) {
          if ((int)local_2c8 < iVar22) {
            iVar22 = (int)local_2c8;
          }
          local_2e8 = &local_278;
          if ((int)local_2b8 == 3) {
            local_2e8 = &local_178;
            pack_A_tile(&local_278,local_2e8,iVar9,iVar16,iVar12,iVar22);
          }
          iVar32 = iVar29;
          iVar10 = 0;
          while (iVar10 < iVar29) {
            iVar17 = iVar32;
            if (TILE_K_1 < iVar32) {
              iVar17 = TILE_K_1;
            }
            sVar25 = (local_2a8->AT_data).elemsize;
            local_118.w = (local_2a8->AT_data).w;
            local_118.cstep = (size_t)local_118.w;
            local_118.elempack = (local_2a8->AT_data).elempack;
            local_118.allocator = (local_2a8->AT_data).allocator;
            local_118.data =
                 (void *)((long)(local_2a8->AT_data).data +
                         sVar25 * local_118.cstep * (long)(iVar10 / TILE_K_1) +
                         (local_2a8->AT_data).cstep * local_2a0 * sVar25);
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)sVar25;
            local_118.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
            local_118.dims = 2;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_88 = (size_t)local_1c8.w;
            local_b8 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
            _TILE_M = (void *)((long)local_1c8.data +
                              local_88 * local_b8 * (long)(iVar10 / TILE_K_1) +
                              (long)(iVar12 / (int)local_2c8) * local_1c8.cstep * local_b8);
            local_c0 = (int *)0x0;
            iVar32 = -(TILE_K_1 - iVar32);
            local_b0 = local_1c8.elempack;
            local_a8 = local_1c8.allocator;
            local_9c = local_1c8.w;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_a0 = local_118.dims;
            local_90 = local_118.c;
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_2e8,&local_178,this_00,(int)local_2b8,iVar9,
                       iVar16,iVar12,iVar22,iVar10,iVar17,
                       (bool)(iVar29 <= iVar10 + TILE_K_1 & (byte)local_288));
            iVar10 = iVar10 + TILE_K_1;
          }
          if (iVar20 != 0) {
            transpose_unpack_output_tile(&local_178,this_00,iVar9,iVar16,iVar12,iVar22);
          }
          this = local_2a8;
        }
        uVar31 = local_2a0 + 1;
      }
      piVar30 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004767a8;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar12 = *(int *)(&this->field_0xf4 + (long)p_Var14);
      local_298 = CONCAT44(local_298._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var14));
      get_optimal_tile_mnk
                (uVar19,*(int *)(&this->field_0xf0 + (long)p_Var14),iVar12,
                 *(int *)(&this->field_0x10c + (long)p_Var14),
                 *(int *)(&this->field_0x110 + (long)p_Var14),
                 *(int *)(&this->field_0x114 + (long)p_Var14),&TILE_M,&TILE_N,&TILE_K,iVar16);
      local_1d8 = (ulong)_TILE_M & 0xffffffff;
      uVar18 = (long)(int)(uVar19 + TILE_M + -1) / (long)TILE_M;
      local_128 = (Mat *)(uVar18 & 0xffffffff);
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      local_1d0 = (ulong)(uint)TILE_K;
      local_290 = CONCAT44(local_290._4_4_,iVar12);
      iVar29 = TILE_N;
      local_d0 = CONCAT71(local_d0._1_7_,iVar20 != 0 || ((int)local_2b8 == 3 || TILE_K < iVar12));
      if (iVar20 != 0 || ((int)local_2b8 == 3 || TILE_K < iVar12)) {
        Mat::create(&local_1c8,TILE_N * TILE_M,1,iVar16,4,opt->workspace_allocator);
      }
      if ((int)uVar18 < 1) {
        local_128 = (Mat *)0x0;
      }
      iVar12 = (int)local_290;
      for (pMVar28 = (Mat *)0x0; pMVar28 != local_128; pMVar28 = (Mat *)((long)&pMVar28->data + 1))
      {
        iVar16 = (int)pMVar28 * (int)local_1d8;
        uVar19 = (int)uVar15 - iVar16;
        local_2a0 = (ulong)uVar19;
        if ((int)local_1d8 < (int)uVar19) {
          local_2a0 = local_1d8 & 0xffffffff;
        }
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        if ((char)local_d0 != '\0') {
          iVar9 = get_omp_thread_num();
          uVar15 = CONCAT44(local_1c8.elemsize._4_4_,(int)local_1c8.elemsize);
          local_228.cstep =
               ((long)local_1c8.w * (long)local_1c8.h * uVar15 + 0xf & 0xfffffffffffffff0) / uVar15;
          if (local_1c8.dims == 4) {
            local_228.cstep = (long)local_1c8.w * (long)local_1c8.h;
          }
          local_228.dims = local_1c8.dims + -1;
          local_228.data = (void *)((long)iVar9 * uVar15 * local_1c8.cstep + (long)local_1c8.data);
          local_228.elemsize._0_4_ = (int)local_1c8.elemsize;
          local_228.elemsize._4_4_ = local_1c8.elemsize._4_4_;
          local_228.elempack = local_1c8.elempack;
          local_228.allocator = local_1c8.allocator;
          local_228.w = local_1c8.w;
          local_228.h = local_1c8.h;
          local_228.d = 1;
          local_228.c = local_1c8.d;
        }
        local_228.refcount._4_4_ = 0;
        local_228.refcount._0_4_ = 0;
        uVar15 = 0;
        local_288 = pMVar28;
        while( true ) {
          iVar22 = (int)uVar15;
          iVar9 = (int)local_298 - iVar22;
          if (iVar9 == 0 || (int)local_298 < iVar22) break;
          if (iVar29 < iVar9) {
            iVar9 = iVar29;
          }
          local_2f0 = &local_278;
          if ((int)local_2b8 == 3) {
            local_2f0 = &local_228;
            pack_A_tile(&local_278,local_2f0,iVar16,(int)local_2a0,iVar22,iVar9);
          }
          iVar22 = iVar12;
          local_2c8 = uVar15;
          iVar32 = 0;
          while( true ) {
            iVar10 = (int)local_2c8;
            if (iVar12 <= iVar32) break;
            iVar11 = (int)local_1d0;
            iVar17 = iVar22;
            if (iVar11 < iVar22) {
              iVar17 = iVar11;
            }
            sVar25 = (local_2a8->AT_data).elemsize;
            local_178.w = (local_2a8->AT_data).w;
            local_178.cstep = (size_t)local_178.w;
            local_178.elempack = (local_2a8->AT_data).elempack;
            local_178.allocator = (local_2a8->AT_data).allocator;
            local_178.data =
                 (void *)((long)(local_2a8->AT_data).data +
                         sVar25 * local_178.cstep * (long)(iVar32 / iVar11) +
                         (local_2a8->AT_data).cstep * (long)pMVar28 * sVar25);
            local_178.refcount._0_4_ = 0;
            local_178.refcount._4_4_ = 0;
            local_178.elemsize._0_4_ = (int)sVar25;
            local_178.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
            local_178.dims = 2;
            local_178.h = 1;
            local_178.d = 1;
            local_178.c = 1;
            local_118.w = (local_2a8->BT_data).w;
            local_118.cstep = (size_t)local_118.w;
            sVar25 = (local_2a8->BT_data).elemsize;
            local_118.elempack = (local_2a8->BT_data).elempack;
            local_118.data =
                 (void *)((long)(local_2a8->BT_data).data +
                         local_118.cstep * sVar25 * (long)(iVar32 / iVar11) +
                         (long)(int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 |
                                           local_2c8 & 0xffffffff) / (long)iVar29) *
                         (local_2a8->BT_data).cstep * sVar25);
            local_118.allocator = (local_2a8->BT_data).allocator;
            iVar12 = (int)local_290;
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (int)sVar25;
            local_118.elemsize._4_4_ = (undefined4)(sVar25 >> 0x20);
            iVar22 = -(iVar11 - iVar22);
            local_118.h = 1;
            local_118.d = 1;
            local_118.dims = local_178.dims;
            local_118.c = local_178.c;
            gemm_transB_packed_tile
                      (&local_178,&local_118,local_2f0,&local_228,this_00,(int)local_2b8,iVar16,
                       (int)local_2a0,iVar10,iVar9,iVar32,iVar17,
                       (int)local_290 <= iVar32 + iVar11 && iVar20 == 0);
            pMVar28 = local_288;
            iVar32 = iVar32 + iVar11;
          }
          if (iVar20 != 0) {
            transpose_unpack_output_tile(&local_228,this_00,iVar16,(int)local_2a0,iVar10,iVar9);
          }
          uVar15 = (ulong)(uint)(iVar10 + iVar29);
        }
        uVar15 = local_230;
        this = local_2a8;
      }
      piVar30 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      iVar16 = (int)local_120;
      if (piVar30 != (int *)0x0) {
        LOCK();
        *piVar30 = *piVar30 + -1;
        UNLOCK();
        if (*piVar30 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
LAB_004767a8:
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  pp_Var2 = this->_vptr_Gemm_x86_avx;
  if (*(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]) == 1.0) {
    iVar12 = 0;
  }
  else {
    uVar19 = iVar16 * (int)this_00->cstep * this_00->c;
    iVar12 = 0;
    uVar15 = (ulong)uVar19;
    if ((int)uVar19 < 1) {
      uVar15 = 0;
    }
    for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      *(float *)((long)this_00->data + uVar18 * 4) =
           *(float *)((long)this_00->data + uVar18 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]);
    }
  }
LAB_00476813:
  piVar30 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        free(local_278.data);
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int Gemm_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}